

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall cmdline::parser::parse(parser *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  mapped_type *ppoVar7;
  size_type sVar8;
  pointer ppVar9;
  size_type sVar10;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  iterator p_2;
  int j;
  char last;
  string name_1;
  string val;
  string name;
  char *p_1;
  int i;
  char initial;
  iterator p;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lookup;
  value_type *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaa4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffab0;
  allocator<char> *in_stack_fffffffffffffab8;
  mapped_type *in_stack_fffffffffffffac0;
  allocator<char> *in_stack_fffffffffffffad0;
  mapped_type *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  mapped_type *in_stack_fffffffffffffae8;
  string *in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  mapped_type *in_stack_fffffffffffffb58;
  parser *in_stack_fffffffffffffb60;
  string local_3c0 [32];
  string local_3a0 [32];
  _Self local_380;
  _Self local_378;
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [39];
  undefined1 local_319 [33];
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [32];
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [32];
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [32];
  string local_220 [32];
  int local_200;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  char *local_120;
  int local_114;
  _Base_ptr local_110;
  undefined4 local_108;
  allocator<char> local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [39];
  char local_99;
  _Self local_98;
  _Self local_90 [9];
  allocator<char> local_41;
  string local_40 [32];
  undefined8 *local_20;
  int local_14;
  bool local_1;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x10cb2a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x10cb3e);
  if (local_14 < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                in_stack_fffffffffffffa98);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    local_1 = false;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                            (char *)in_stack_fffffffffffffa98);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x68),(char *)*local_20);
    }
    std::
    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x10cc63);
    local_90[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)in_stack_fffffffffffffa98);
    while( true ) {
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)in_stack_fffffffffffffa98);
      bVar1 = std::operator!=(local_90,&local_98);
      if (!bVar1) break;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                    *)0x10ccb8);
      lVar4 = std::__cxx11::string::length();
      if (lVar4 != 0) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                               *)0x10ccd8);
        iVar2 = (*ppVar9->second->_vptr_option_base[9])();
        local_99 = (char)iVar2;
        if (local_99 != '\0') {
          sVar8 = std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::count(in_stack_fffffffffffffab0,(key_type *)in_stack_fffffffffffffaa8);
          if (sVar8 != 0) {
            pmVar5 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                                  (key_type *)in_stack_fffffffffffffad8);
            std::__cxx11::string::operator=((string *)pmVar5,"");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                       (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
            std::operator+(in_stack_fffffffffffffaa8,(char)((uint)in_stack_fffffffffffffaa4 >> 0x18)
                          );
            std::operator+(in_stack_fffffffffffffaa8,
                           (char *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                        in_stack_fffffffffffffa98);
            std::__cxx11::string::~string(local_c0);
            std::__cxx11::string::~string(local_e0);
            std::__cxx11::string::~string(local_100);
            std::allocator<char>::~allocator(&local_101);
            local_1 = false;
            goto LAB_0010dff9;
          }
          ppVar9 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                                 *)0x10cf0e);
          pmVar5 = std::
                   map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                                (key_type *)in_stack_fffffffffffffad8);
          std::__cxx11::string::operator=((string *)pmVar5,(string *)ppVar9);
        }
      }
      local_110 = (_Base_ptr)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                  ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                                *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4);
    }
    for (local_114 = 1; local_114 < local_14; local_114 = local_114 + 1) {
      iVar2 = strncmp((char *)local_20[local_114],"--",2);
      if (iVar2 == 0) {
        local_120 = strchr((char *)(local_20[local_114] + 2),0x3d);
        if (local_120 == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                     (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
          std::allocator<char>::~allocator(&local_191);
          sVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                           *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
          if (sVar6 == 0) {
            std::operator+((char *)in_stack_fffffffffffffae8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                        in_stack_fffffffffffffa98);
            std::__cxx11::string::~string(local_1b8);
            local_108 = 7;
          }
          else {
            ppoVar7 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                                   in_stack_fffffffffffffad8);
            uVar3 = (*(*ppoVar7)->_vptr_option_base[2])();
            if ((uVar3 & 1) == 0) {
              set_option((parser *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                         in_stack_fffffffffffffb08);
            }
            else {
              if (local_14 <= local_114 + 1) {
                std::operator+((char *)in_stack_fffffffffffffae8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                            in_stack_fffffffffffffa98);
                std::__cxx11::string::~string(local_1d8);
                local_108 = 7;
                goto LAB_0010d4d2;
              }
              local_114 = local_114 + 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                         (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
              set_option(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                         (string *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
              std::__cxx11::string::~string(local_1f8);
              std::allocator<char>::~allocator(&local_1f9);
            }
            local_108 = 0;
          }
LAB_0010d4d2:
          std::__cxx11::string::~string(local_190);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                     (char *)in_stack_fffffffffffffab0,(allocator<char> *)in_stack_fffffffffffffaa8)
          ;
          std::allocator<char>::~allocator(&local_141);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                     (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
          std::allocator<char>::~allocator(&local_169);
          set_option(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                     (string *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
          std::__cxx11::string::~string(local_168);
          std::__cxx11::string::~string(local_140);
        }
      }
      else {
        iVar2 = strncmp((char *)local_20[local_114],"-",1);
        if (iVar2 == 0) {
          if (*(char *)(local_20[local_114] + 1) != '\0') {
            local_1fa = *(undefined1 *)(local_20[local_114] + 1);
            for (local_200 = 2; *(char *)(local_20[local_114] + (long)local_200) != '\0';
                local_200 = local_200 + 1) {
              local_1fa = *(undefined1 *)(local_20[local_114] + (long)local_200);
              sVar8 = std::
                      map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::count(in_stack_fffffffffffffab0,(key_type *)in_stack_fffffffffffffaa8);
              if (sVar8 == 0) {
                in_stack_fffffffffffffb60 = (parser *)(in_RDI + 0xa0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                           (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
                std::operator+(in_stack_fffffffffffffaa8,
                               (char)((uint)in_stack_fffffffffffffaa4 >> 0x18));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                            in_stack_fffffffffffffa98);
                std::__cxx11::string::~string(local_220);
                std::__cxx11::string::~string(local_240);
                std::allocator<char>::~allocator(&local_241);
              }
              else {
                in_stack_fffffffffffffb58 =
                     std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                                  (key_type *)in_stack_fffffffffffffad8);
                in_stack_fffffffffffffb57 =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0
                                                ),(char *)in_stack_fffffffffffffa98);
                if ((bool)in_stack_fffffffffffffb57) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                             (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
                  std::operator+(in_stack_fffffffffffffaa8,
                                 (char)((uint)in_stack_fffffffffffffaa4 >> 0x18));
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                              in_stack_fffffffffffffa98);
                  std::__cxx11::string::~string(local_268);
                  std::__cxx11::string::~string(local_288);
                  std::allocator<char>::~allocator(&local_289);
                }
                else {
                  std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                               (key_type *)in_stack_fffffffffffffad8);
                  set_option((parser *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10)
                             ,in_stack_fffffffffffffb08);
                }
              }
            }
            sVar8 = std::
                    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::count(in_stack_fffffffffffffab0,(key_type *)in_stack_fffffffffffffaa8);
            if (sVar8 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                         (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
              std::operator+(in_stack_fffffffffffffaa8,
                             (char)((uint)in_stack_fffffffffffffaa4 >> 0x18));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                          in_stack_fffffffffffffa98);
              std::__cxx11::string::~string(local_2b0);
              std::__cxx11::string::~string(local_2d0);
              std::allocator<char>::~allocator(&local_2d1);
            }
            else {
              std::
              map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                           (key_type *)in_stack_fffffffffffffad8);
              in_stack_fffffffffffffb17 =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                   (char *)in_stack_fffffffffffffa98);
              if ((bool)in_stack_fffffffffffffb17) {
                in_stack_fffffffffffffb08 = (string *)local_319;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                           (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
                std::operator+(in_stack_fffffffffffffaa8,
                               (char)((uint)in_stack_fffffffffffffaa4 >> 0x18));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                            in_stack_fffffffffffffa98);
                std::__cxx11::string::~string(local_2f8);
                std::__cxx11::string::~string((string *)(local_319 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_319);
              }
              else {
                if (local_114 + 1 < local_14) {
                  std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                               (key_type *)in_stack_fffffffffffffad8);
                  in_stack_fffffffffffffae8 =
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0)
                                    ,in_stack_fffffffffffffad8);
                  uVar3 = (*(*in_stack_fffffffffffffae8)->_vptr_option_base[2])();
                  in_stack_fffffffffffffae7 = (undefined1)uVar3;
                  if ((uVar3 & 1) != 0) {
                    in_stack_fffffffffffffad8 =
                         std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)CONCAT17(in_stack_fffffffffffffae7,
                                                  in_stack_fffffffffffffae0),
                                      (key_type *)in_stack_fffffffffffffad8);
                    in_stack_fffffffffffffad0 = &local_341;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                               (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
                    set_option(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
                    std::__cxx11::string::~string(local_340);
                    std::allocator<char>::~allocator(&local_341);
                    local_114 = local_114 + 1;
                    goto LAB_0010de5c;
                  }
                }
                in_stack_fffffffffffffac0 =
                     std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                                  (key_type *)in_stack_fffffffffffffad8);
                set_option((parser *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08);
              }
            }
          }
        }
        else {
          in_stack_fffffffffffffaa8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x88);
          in_stack_fffffffffffffab0 =
               (map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_20[local_114];
          in_stack_fffffffffffffab8 = &local_369;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                     (char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                      in_stack_fffffffffffffa98);
          std::__cxx11::string::~string(local_368);
          std::allocator<char>::~allocator(&local_369);
        }
      }
LAB_0010de5c:
    }
    local_378._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)in_stack_fffffffffffffa98);
    while( true ) {
      local_380._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)in_stack_fffffffffffffa98);
      bVar1 = std::operator!=(&local_378,&local_380);
      if (!bVar1) break;
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                             *)0x10dec7);
      uVar3 = (*ppVar9->second->_vptr_option_base[6])();
      in_stack_fffffffffffffaa4 = CONCAT13((char)uVar3,(int3)in_stack_fffffffffffffaa4);
      if ((uVar3 & 1) == 0) {
        in_stack_fffffffffffffa98 = (value_type *)(in_RDI + 0xa0);
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                               *)0x10df07);
        std::__cxx11::string::string(local_3c0,(string *)ppVar9);
        std::operator+((char *)in_stack_fffffffffffffaa8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                    in_stack_fffffffffffffa98);
        std::__cxx11::string::~string(local_3a0);
        std::__cxx11::string::~string(local_3c0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                    *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4);
    }
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(in_RDI + 0xa0));
    local_1 = sVar10 == 0;
LAB_0010dff9:
    local_108 = 1;
    std::
    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x10e006);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool parse(int argc, const char * const argv[]){
    errors.clear();
    others.clear();

    if (argc<1){
      errors.push_back("argument number must be longer than 0");
      return false;
    }
    if (prog_name=="")
      prog_name=argv[0];

    std::map<char, std::string> lookup;
    for (std::map<std::string, option_base*>::iterator p=options.begin();
         p!=options.end(); p++){
      if (p->first.length()==0) continue;
      char initial=p->second->short_name();
      if (initial){
        if (lookup.count(initial)>0){
          lookup[initial]="";
          errors.push_back(std::string("short option '")+initial+"' is ambiguous");
          return false;
        }
        else lookup[initial]=p->first;
      }
    }

    for (int i=1; i<argc; i++){
      if (strncmp(argv[i], "--", 2)==0){
        const char *p=strchr(argv[i]+2, '=');
        if (p){
          std::string name(argv[i]+2, p);
          std::string val(p+1);
          set_option(name, val);
        }
        else{
          std::string name(argv[i]+2);
          if (options.count(name)==0){
            errors.push_back("undefined option: --"+name);
            continue;
          }
          if (options[name]->has_value()){
            if (i+1>=argc){
              errors.push_back("option needs value: --"+name);
              continue;
            }
            else{
              i++;
              set_option(name, argv[i]);
            }
          }
          else{
            set_option(name);
          }
        }
      }
      else if (strncmp(argv[i], "-", 1)==0){
        if (!argv[i][1]) continue;
        char last=argv[i][1];
        for (int j=2; argv[i][j]; j++){
          last=argv[i][j];
          if (lookup.count(argv[i][j-1])==0){
            errors.push_back(std::string("undefined short option: -")+argv[i][j-1]);
            continue;
          }
          if (lookup[argv[i][j-1]]==""){
            errors.push_back(std::string("ambiguous short option: -")+argv[i][j-1]);
            continue;
          }
          set_option(lookup[argv[i][j-1]]);
        }

        if (lookup.count(last)==0){
          errors.push_back(std::string("undefined short option: -")+last);
          continue;
        }
        if (lookup[last]==""){
          errors.push_back(std::string("ambiguous short option: -")+last);
          continue;
        }

        if (i+1<argc && options[lookup[last]]->has_value()){
          set_option(lookup[last], argv[i+1]);
          i++;
        }
        else{
          set_option(lookup[last]);
        }
      }
      else{
        others.push_back(argv[i]);
      }
    }

    for (std::map<std::string, option_base*>::iterator p=options.begin();
         p!=options.end(); p++)
      if (!p->second->valid())
        errors.push_back("need option: --"+std::string(p->first));

    return errors.size()==0;
  }